

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

void __thiscall CFG::eliminateUselessSymbols(CFG *this)

{
  eliminateNonGeneratingSymbols(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Eliminated non-generating symbols: ",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  printReadable(this);
  eliminateNonReachableSymbols(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Eliminated non-reachable symbols: ",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  printReadable(this);
  return;
}

Assistant:

void CFG::eliminateUselessSymbols() {
    eliminateNonGeneratingSymbols();

    std::cout << "Eliminated non-generating symbols: " << std::endl;
    printReadable();

    eliminateNonReachableSymbols();

    std::cout << "Eliminated non-reachable symbols: " << std::endl;
    printReadable();
}